

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Command * __thiscall Command::execute(Command *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer piVar3;
  int iVar4;
  string *this_00;
  string *arg;
  pointer pbVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  int x;
  string b;
  stringstream a;
  
  bVar2 = std::operator==(&this->name,"p");
  if (bVar2) {
    pbVar1 = (this->args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    dVar6 = extraout_XMM0_Qa;
    for (pbVar5 = (this->args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      dVar6 = log(dVar6);
    }
    return this;
  }
  bVar2 = std::operator==(&this->name,"l");
  if (bVar2) {
    pbVar1 = (this->args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    dVar6 = extraout_XMM0_Qa_00;
    for (pbVar5 = (this->args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      dVar6 = log(dVar6);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"\n",(allocator<char> *)&b);
    log(__x);
LAB_0010665a:
    this_00 = (string *)&a;
LAB_0010665f:
    std::__cxx11::string::~string((string *)this_00);
    return this;
  }
  bVar2 = std::operator==(&this->name,"i");
  if (bVar2) {
    b._M_dataplus._M_p = (pointer)&b.field_2;
    b._M_string_length = 0;
    b.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&b);
    std::__cxx11::stringstream::stringstream((stringstream *)&a,(string *)&b,_S_out|_S_in);
    std::istream::operator>>((istream *)&a,&x);
    pushStack(this,x);
    std::__cxx11::stringstream::~stringstream((stringstream *)&a);
    this_00 = &b;
    goto LAB_0010665f;
  }
  bVar2 = std::operator==(&this->name,"s");
  if (bVar2) {
    piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = piVar3[-1] - piVar3[-2];
  }
  else {
    bVar2 = std::operator==(&this->name,"a");
    if (bVar2) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = piVar3[-2] + piVar3[-1];
    }
    else {
      bVar2 = std::operator==(&this->name,"d");
      if (bVar2) {
        piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar4 = piVar3[-1] / piVar3[-2];
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar3 + -2;
        goto LAB_001066ad;
      }
      bVar2 = std::operator==(&this->name,"m");
      if (!bVar2) {
        bVar2 = std::operator==(&this->name,"b");
        if (bVar2) {
          piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar4 = piVar3[-1];
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3 + -1;
          pushStack(this,iVar4);
          goto LAB_001066ad;
        }
        bVar2 = std::operator==(&this->name,"t");
        if (bVar2) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&a,
                     (string *)
                     (this->args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,_S_out|_S_in);
          std::istream::operator>>((istream *)&a,(int *)&b);
          pushStack(this,(int)b._M_dataplus._M_p);
          std::__cxx11::stringstream::~stringstream((stringstream *)&a);
          return this;
        }
        bVar2 = std::operator==(&this->name,"P");
        if (bVar2) {
          piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar4 = piVar3[-1];
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3 + -1;
          std::__cxx11::to_string((string *)&a,iVar4);
          log(__x_00);
        }
        else {
          bVar2 = std::operator==(&this->name,"L");
          if (!bVar2) {
            return this;
          }
          piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar4 = piVar3[-1];
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3 + -1;
          std::__cxx11::to_string((string *)&a,iVar4);
          log(__x_01);
          std::__cxx11::string::~string((string *)&a);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&a,"\n",(allocator<char> *)&b);
          log(__x_02);
        }
        goto LAB_0010665a;
      }
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = piVar3[-2] * piVar3[-1];
    }
  }
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar3 + -2;
LAB_001066ad:
  pushStack(this,iVar4);
  return this;
}

Assistant:

Command& execute() {
            if (name == "p")
                for (const string& arg : args) log(arg);
            else if (name == "l") {
                for (const string& arg : args) log(arg);
                log("\n");
            }
            else if (name == "i") {
                string b;
                cin >> b;
                stringstream a(b);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "s")
                pushStack(popStack() - popStack());
            else if (name == "a")
                pushStack(popStack() + popStack());
            else if (name == "d")
                pushStack(popStack() / popStack());
            else if (name == "m")
                pushStack(popStack() * popStack());
            else if (name == "b") {
                int x = popStack();
                pushStack(x);
                pushStack(x);
            }
            else if (name == "t") {
                stringstream a(args[0]);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "P")
                log(to_string(popStack()));
            else if (name == "L") {
                log(to_string(popStack()));
                log("\n");
            }
            return *this;
        }